

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

void __thiscall
dap::ResponseOrError<dap::SetBreakpointsResponse>::~ResponseOrError
          (ResponseOrError<dap::SetBreakpointsResponse> *this)

{
  ResponseOrError<dap::SetBreakpointsResponse> *this_local;
  
  Error::~Error(&this->error);
  SetBreakpointsResponse::~SetBreakpointsResponse(&this->response);
  return;
}

Assistant:

inline ResponseOrError() = default;